

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

BigInteger * __thiscall
Algorithms::discreteLog
          (BigInteger *__return_storage_ptr__,Algorithms *this,BigInteger *a,BigInteger *b,
          BigInteger *m)

{
  bool bVar1;
  longlong lVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  ostream *poVar5;
  int i;
  long lVar6;
  double in_XMM0_Qa;
  BigInteger A;
  BigInteger n;
  map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  mp;
  BigInteger local_90;
  BigInteger cur_a;
  BigInteger local_50;
  
  BigIntegerLibrary::sqrt((BigIntegerLibrary *)&A,in_XMM0_Qa);
  lVar6 = 1;
  BigIntegerLibrary::BigInteger::operator+((BigInteger *)&mp,&A,1);
  BigIntegerLibrary::BigInteger::operator/(&n,(BigInteger *)&mp,100);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&mp);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&A);
  BigIntegerLibrary::powm(&A,a,&n,m);
  BigIntegerLibrary::BigInteger::BigInteger(&cur_a,&A);
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mp._M_t._M_impl.super__Rb_tree_header._M_header;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    lVar2 = BigIntegerLibrary::BigInteger::to_int(&n);
    if (lVar2 < lVar6) break;
    BigIntegerLibrary::BigInteger::BigInteger(&local_90,lVar6);
    pmVar3 = std::
             map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
             ::operator[](&mp,&cur_a);
    BigIntegerLibrary::BigInteger::operator=(pmVar3,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    BigIntegerLibrary::BigInteger::operator*(&local_50,&cur_a,&A);
    BigIntegerLibrary::BigInteger::operator%(&local_90,&local_50,m);
    BigIntegerLibrary::BigInteger::operator=(&cur_a,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    lVar6 = lVar6 + 1;
  }
  BigIntegerLibrary::BigInteger::operator=(&cur_a,b);
  lVar6 = 0;
  while( true ) {
    lVar2 = BigIntegerLibrary::BigInteger::to_int(&n);
    if (lVar2 <= lVar6) break;
    sVar4 = std::
            map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
            ::count(&mp,&cur_a);
    if (sVar4 != 0) {
      pmVar3 = std::
               map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
               ::operator[](&mp,&cur_a);
      BigIntegerLibrary::BigInteger::operator*(&local_90,pmVar3,&n);
      BigIntegerLibrary::BigInteger::operator-(__return_storage_ptr__,&local_90,lVar6);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      bVar1 = BigIntegerLibrary::BigInteger::operator<(__return_storage_ptr__,m);
      if (bVar1) goto LAB_0010740e;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)__return_storage_ptr__);
    }
    BigIntegerLibrary::BigInteger::operator*(&local_50,&cur_a,a);
    BigIntegerLibrary::BigInteger::operator%(&local_90,&local_50,m);
    BigIntegerLibrary::BigInteger::operator=(&cur_a,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    lVar6 = lVar6 + 1;
  }
  poVar5 = BigIntegerLibrary::operator<<((ostream *)&std::cout,&n);
  std::endl<char,std::char_traits<char>>(poVar5);
  BigIntegerLibrary::BigInteger::BigInteger(__return_storage_ptr__,-1);
LAB_0010740e:
  std::
  _Rb_tree<BigIntegerLibrary::BigInteger,_std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>,_std::_Select1st<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  ::~_Rb_tree(&mp._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cur_a);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&A);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&n);
  return __return_storage_ptr__;
}

Assistant:

BigInteger Algorithms::discreteLog(BigInteger a, BigInteger b, BigInteger m) {
    BigInteger n = (sqrt(m) + 1) / 100;
    BigInteger A = powm(a, n, m);
    BigInteger cur_a = A;
    map<BigInteger, BigInteger> mp;
    for (int i = 1; i <= n.to_int(); ++i) {
        mp[cur_a] = i;
        cur_a = (cur_a * A) % m;
    }
    cur_a = b;
    for (int i = 0; i < n.to_int(); ++i) {
        if (mp.count(cur_a)) {
            BigInteger ans = mp[cur_a] * n - i;
            if (ans < m) {
                return ans;
            }
        }
        cur_a = (cur_a * a) % m;
    }
    cout << n << endl;
    return -1;
}